

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_3> * tcu::reflect<double,3>(Vector<double,_3> *i,Vector<double,_3> *n)

{
  Vector<double,_3> *res_2;
  int i_1;
  long lVar1;
  double res;
  double dVar2;
  Vector<double,_3> res_1;
  
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + n->m_data[lVar1] * i->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = n->m_data[lVar1] * (dVar2 + dVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2->m_data[0] = 0.0;
  res_2->m_data[1] = 0.0;
  res_2->m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res_2->m_data[lVar1] = i->m_data[lVar1] - res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return res_2;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}